

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeOpen(sqlite3_vfs *pVfs,char *zFilename,sqlite3 *db,Btree **ppBtree,int flags,
                    int vfsFlags)

{
  char cVar1;
  long lVar2;
  long lVar3;
  PCache *pCache;
  sqlite3_file *psVar4;
  sqlite3_io_methods *psVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  Btree *p;
  BtShared *p_00;
  Pager *pPVar11;
  ulong uVar12;
  void *pvVar13;
  sqlite3_mutex *psVar14;
  sqlite3_mutex *psVar15;
  byte bVar16;
  long lVar17;
  ulong uVar18;
  Btree *pBVar19;
  code *pcVar20;
  Btree *pBVar21;
  int iVar22;
  uint uVar23;
  Btree *pBVar24;
  Btree *pBVar25;
  Btree **ppBVar26;
  BtShared **ppBVar27;
  u8 uVar28;
  char *pcVar29;
  byte bVar30;
  long in_FS_OFFSET;
  bool bVar31;
  bool bVar32;
  sqlite3_mutex *local_120;
  Pager *local_118;
  uint local_10c;
  char *local_f0;
  u8 local_e0;
  char *local_d8;
  uint local_ac;
  uchar zDbHeader [100];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (zFilename == (char *)0x0) {
LAB_0021fc36:
    bVar31 = true;
    if (db->temp_store != '\x02') goto LAB_0021fc4d;
LAB_0021fc40:
    local_10c = flags | 2;
    bVar16 = 1;
  }
  else {
    cVar1 = *zFilename;
    bVar31 = cVar1 == '\0';
    iVar6 = strcmp(zFilename,":memory:");
    if (iVar6 == 0) goto LAB_0021fc40;
    if (cVar1 == '\0') goto LAB_0021fc36;
    bVar31 = false;
LAB_0021fc4d:
    bVar16 = (byte)((vfsFlags & 0x80U) >> 7);
    local_10c = flags | (vfsFlags & 0x80U) >> 6;
  }
  uVar10 = vfsFlags & 0xfffffcffU | 0x200;
  if (bVar16 == 0 && !bVar31) {
    uVar10 = vfsFlags;
  }
  if ((vfsFlags & 0x100U) == 0) {
    uVar10 = vfsFlags;
  }
  p = (Btree *)sqlite3MallocZero(0x48);
  iVar6 = 7;
  if (p == (Btree *)0x0) goto LAB_00220592;
  p->inTrans = '\0';
  p->db = db;
  (p->lock).pBtree = p;
  (p->lock).iTable = 1;
  if ((!bVar31) && ((uVar10 >> 0x11 & 1) != 0 && ((uVar10 & 0x40) == 0 & bVar16) == 0)) {
    iVar6 = sqlite3Strlen30(zFilename);
    uVar8 = iVar6 + 1;
    uVar7 = pVfs->mxPathname + 1;
    uVar23 = uVar8;
    if ((int)uVar8 < (int)uVar7) {
      uVar23 = uVar7;
    }
    pcVar29 = (char *)sqlite3Malloc((ulong)uVar23);
    p->sharable = '\x01';
    if (pcVar29 == (char *)0x0) {
      sqlite3_free(p);
      iVar6 = 7;
      goto LAB_00220592;
    }
    if (bVar16 == 0) {
      *pcVar29 = '\0';
      iVar6 = (*pVfs->xFullPathname)(pVfs,zFilename,uVar7,pcVar29);
      if (iVar6 != 0) {
        sqlite3_free(pcVar29);
        sqlite3_free(p);
        goto LAB_00220592;
      }
    }
    else {
      memcpy(pcVar29,zFilename,(ulong)uVar8);
    }
    bVar31 = true;
    if (sqlite3Config.bCoreMutex == 0) {
      psVar14 = (sqlite3_mutex *)0x0;
      bVar32 = true;
      local_120 = (sqlite3_mutex *)0x0;
    }
    else {
      local_120 = (*sqlite3Config.mutex.xMutexAlloc)(4);
      bVar32 = local_120 == (sqlite3_mutex *)0x0;
      if (!bVar32) {
        (*sqlite3Config.mutex.xMutexEnter)(local_120);
      }
      if ((sqlite3Config.bCoreMutex == 0) ||
         (psVar14 = (*sqlite3Config.mutex.xMutexAlloc)(2), psVar14 == (sqlite3_mutex *)0x0)) {
        psVar14 = (sqlite3_mutex *)0x0;
      }
      else {
        (*sqlite3Config.mutex.xMutexEnter)(psVar14);
        bVar31 = false;
      }
    }
    ppBVar27 = &sqlite3SharedCacheList;
    while (p_00 = *ppBVar27, p_00 != (BtShared *)0x0) {
      pPVar11 = p_00->pPager;
      iVar6 = strcmp(pcVar29,pPVar11->zFilename);
      if ((iVar6 == 0) && (pPVar11->pVfs == pVfs)) {
        uVar12 = (ulong)(uint)db->nDb;
        lVar17 = uVar12 * 0x20 + -0x18;
        goto LAB_0022028a;
      }
      ppBVar27 = &p_00->pNext;
    }
    goto LAB_002202bf;
  }
  local_120 = (sqlite3_mutex *)0x0;
LAB_0021fce4:
  p_00 = (BtShared *)sqlite3MallocZero(0x88);
  if (p_00 == (BtShared *)0x0) {
    iVar6 = 7;
  }
  else {
    zDbHeader[0] = '\0';
    zDbHeader[1] = '\x10';
    zDbHeader[2] = '\0';
    zDbHeader[3] = '\0';
    iVar22 = 0x58;
    if (0x58 < pVfs->szOsFile) {
      iVar22 = pVfs->szOsFile;
    }
    p_00->pPager = (Pager *)0x0;
    uVar23 = local_10c & 2;
    local_d8 = zFilename;
    if (uVar23 == 0) {
      if (zFilename == (char *)0x0) {
        local_d8 = (char *)0x0;
        bVar31 = true;
LAB_0021ffe3:
        local_e0 = '\0';
        goto LAB_00220007;
      }
      if (*zFilename == '\0') {
        bVar31 = false;
        goto LAB_0021ffe3;
      }
      iVar6 = pVfs->mxPathname;
      pPVar11 = (Pager *)sqlite3Malloc((long)iVar6 * 2 + 2);
      if (pPVar11 == (Pager *)0x0) goto LAB_0022021f;
      *(char *)&pPVar11->pVfs = '\0';
      iVar6 = (*pVfs->xFullPathname)(pVfs,zFilename,iVar6 + 1,(char *)pPVar11);
      uVar7 = sqlite3Strlen30((char *)pPVar11);
      uVar8 = sqlite3Strlen30(zFilename);
      local_f0 = zFilename + (ulong)uVar8 + 1;
      for (pcVar29 = local_f0; *pcVar29 != '\0'; pcVar29 = pcVar29 + (ulong)uVar9 + (ulong)uVar8 + 2
          ) {
        uVar8 = sqlite3Strlen30(pcVar29);
        uVar9 = sqlite3Strlen30(pcVar29 + (ulong)uVar8 + 1);
      }
      if (iVar6 == 0) {
        if ((int)(uVar7 + 8) <= pVfs->mxPathname) {
          iVar6 = ((int)pcVar29 - (int)local_f0) + 1;
          bVar31 = false;
          local_e0 = '\0';
          local_118 = pPVar11;
          goto LAB_0022001e;
        }
        iVar6 = sqlite3CantopenError(0xcbc8);
      }
LAB_00220549:
      sqlite3_free(pPVar11);
    }
    else {
      if (zFilename == (char *)0x0) {
        local_e0 = '\x01';
        local_d8 = (char *)0x0;
        bVar31 = true;
LAB_00220007:
        local_118 = (Pager *)0x0;
        uVar7 = 0;
        local_f0 = (char *)0x0;
        iVar6 = 0;
      }
      else {
        if (*zFilename == '\0') {
          local_e0 = '\x01';
          bVar31 = false;
          goto LAB_00220007;
        }
        iVar6 = 0;
        local_118 = (Pager *)sqlite3DbStrDup((sqlite3 *)0x0,zFilename);
        if (local_118 == (Pager *)0x0) goto LAB_0022021f;
        uVar7 = sqlite3Strlen30((char *)local_118);
        bVar31 = true;
        local_d8 = (char *)0x0;
        local_e0 = '\x01';
        local_f0 = (char *)0x0;
      }
LAB_0022001e:
      uVar18 = (ulong)uVar7;
      uVar12 = (ulong)(iVar22 + 7U & 0x7ffffff8);
      pPVar11 = (Pager *)sqlite3MallocZero(((long)pVfs->szOsFile + 7U & 0xfffffffffffffff8) +
                                           uVar18 * 3 + uVar12 * 2 + (long)iVar6 + 0x189);
      if (pPVar11 != (Pager *)0x0) {
        pPVar11->pPCache = (PCache *)(pPVar11 + 1);
        pPVar11->fd = (sqlite3_file *)&pPVar11[1].fd;
        pcVar29 = pPVar11[1].dbFileVers + (((long)pVfs->szOsFile + 7U & 0xfffffffffffffff8) - 0x40);
        pPVar11->sjfd = (sqlite3_file *)pcVar29;
        pPVar11->jfd = (sqlite3_file *)(pcVar29 + uVar12);
        pcVar29 = pcVar29 + uVar12 + uVar12;
        pPVar11->zFilename = pcVar29;
        if (local_118 != (Pager *)0x0) {
          pPVar11->zJournal = pcVar29 + (int)(iVar6 + uVar7 + 1);
          memcpy(pcVar29,local_118,uVar18);
          if (iVar6 != 0) {
            memcpy(pPVar11->zFilename + (uVar7 + 1),local_f0,(long)iVar6);
          }
          memcpy(pPVar11->zJournal,local_118,uVar18);
          builtin_strncpy(pPVar11->zJournal + uVar18,"-journal",9);
          (pPVar11->zJournal + uVar18 + 8)[1] = '\0';
          pPVar11->zWal = pPVar11->zJournal + uVar18 + 9;
          memcpy(pPVar11->zJournal + uVar18 + 9,local_118,uVar18);
          builtin_strncpy(pPVar11->zWal + uVar18,"-wal",5);
          sqlite3_free(local_118);
        }
        pPVar11->pVfs = pVfs;
        pPVar11->vfsFlags = uVar10;
        if ((bVar31) || (*local_d8 == '\0')) {
LAB_00220481:
          pPVar11->eState = '\x01';
          pPVar11->eLock = '\x04';
          pPVar11->noLock = '\x01';
          bVar30 = (byte)uVar10 & 1;
          uVar28 = '\x01';
          bVar31 = false;
LAB_00220494:
          iVar6 = sqlite3PagerSetPagesize(pPVar11,(u32 *)zDbHeader,-1);
          if (iVar6 == 0) {
            pcVar20 = (_func_int_void_ptr_PgHdr_ptr *)0x0;
            if (uVar23 == 0) {
              pcVar20 = pagerStress;
            }
            pCache = pPVar11->pPCache;
            pCache->szSpill = 0;
            pCache->szPage = 0;
            pCache->szExtra = 0;
            pCache->bPurgeable = '\0';
            pCache->eCreate = '\0';
            *(undefined2 *)&pCache->field_0x2e = 0;
            pCache->xStress = (_func_int_void_ptr_PgHdr_ptr *)0x0;
            pCache->pStress = (void *)0x0;
            pCache->pSynced = (PgHdr *)0x0;
            pCache->nRefSum = 0;
            pCache->szCache = 0;
            pCache->pDirty = (PgHdr *)0x0;
            pCache->pDirtyTail = (PgHdr *)0x0;
            pCache->pCache = (sqlite3_pcache *)0x0;
            pCache->szExtra = 0x88;
            pCache->bPurgeable = (byte)(uVar23 >> 1) ^ 1;
            pCache->eCreate = '\x02';
            pCache->xStress = pcVar20;
            pCache->pStress = pPVar11;
            pCache->szCache = 100;
            pCache->szSpill = 1;
            pCache->szPage = 1;
            iVar6 = sqlite3PcacheSetPageSize(pCache,zDbHeader._0_4_);
            if (iVar6 == 0) {
              pPVar11->useJournal = (byte)(local_10c & 1) ^ 1;
              pPVar11->mxPgno = 0x3fffffff;
              pPVar11->tempFile = uVar28;
              pPVar11->exclusiveMode = uVar28;
              pPVar11->changeCountDone = uVar28;
              pPVar11->memDb = local_e0;
              pPVar11->readOnly = bVar30;
              pPVar11->noSync = uVar28;
              if (bVar31) {
                pPVar11->syncFlags = '\x02';
                pPVar11->fullSync = '\x01';
                pPVar11->extraSync = '\0';
                pPVar11->ckptSyncFlags = '\x02';
                pPVar11->walSyncFlags = '\"';
              }
              pPVar11->nExtra = 0x88;
              pPVar11->journalSizeLimit = -1;
              setSectorSize(pPVar11);
              if ((local_10c & 3) != 0) {
                pPVar11->journalMode = ((local_10c & 1) == 0) * '\x02' + '\x02';
              }
              pPVar11->xReiniter = pageReinit;
              setGetterMethod(pPVar11);
              p_00->pPager = pPVar11;
              pPVar11->szMmap = db->szMmap;
              pagerFixMaplimit(pPVar11);
              zDbHeader[0x50] = '\0';
              zDbHeader[0x51] = '\0';
              zDbHeader[0x52] = '\0';
              zDbHeader[0x53] = '\0';
              zDbHeader[0x54] = '\0';
              zDbHeader[0x55] = '\0';
              zDbHeader[0x56] = '\0';
              zDbHeader[0x57] = '\0';
              zDbHeader[0x58] = '\0';
              zDbHeader[0x59] = '\0';
              zDbHeader[0x5a] = '\0';
              zDbHeader[0x5b] = '\0';
              zDbHeader[0x5c] = '\0';
              zDbHeader[0x5d] = '\0';
              zDbHeader[0x5e] = '\0';
              zDbHeader[0x5f] = '\0';
              zDbHeader[0x40] = '\0';
              zDbHeader[0x41] = '\0';
              zDbHeader[0x42] = '\0';
              zDbHeader[0x43] = '\0';
              zDbHeader[0x44] = '\0';
              zDbHeader[0x45] = '\0';
              zDbHeader[0x46] = '\0';
              zDbHeader[0x47] = '\0';
              zDbHeader[0x48] = '\0';
              zDbHeader[0x49] = '\0';
              zDbHeader[0x4a] = '\0';
              zDbHeader[0x4b] = '\0';
              zDbHeader[0x4c] = '\0';
              zDbHeader[0x4d] = '\0';
              zDbHeader[0x4e] = '\0';
              zDbHeader[0x4f] = '\0';
              zDbHeader[0x30] = '\0';
              zDbHeader[0x31] = '\0';
              zDbHeader[0x32] = '\0';
              zDbHeader[0x33] = '\0';
              zDbHeader[0x34] = '\0';
              zDbHeader[0x35] = '\0';
              zDbHeader[0x36] = '\0';
              zDbHeader[0x37] = '\0';
              zDbHeader[0x38] = '\0';
              zDbHeader[0x39] = '\0';
              zDbHeader[0x3a] = '\0';
              zDbHeader[0x3b] = '\0';
              zDbHeader[0x3c] = '\0';
              zDbHeader[0x3d] = '\0';
              zDbHeader[0x3e] = '\0';
              zDbHeader[0x3f] = '\0';
              zDbHeader[0x20] = '\0';
              zDbHeader[0x21] = '\0';
              zDbHeader[0x22] = '\0';
              zDbHeader[0x23] = '\0';
              zDbHeader[0x24] = '\0';
              zDbHeader[0x25] = '\0';
              zDbHeader[0x26] = '\0';
              zDbHeader[0x27] = '\0';
              zDbHeader[0x28] = '\0';
              zDbHeader[0x29] = '\0';
              zDbHeader[0x2a] = '\0';
              zDbHeader[0x2b] = '\0';
              zDbHeader[0x2c] = '\0';
              zDbHeader[0x2d] = '\0';
              zDbHeader[0x2e] = '\0';
              zDbHeader[0x2f] = '\0';
              zDbHeader[0x10] = '\0';
              zDbHeader[0x11] = '\0';
              zDbHeader[0x12] = '\0';
              zDbHeader[0x13] = '\0';
              zDbHeader[0x14] = '\0';
              zDbHeader[0x15] = '\0';
              zDbHeader[0x16] = '\0';
              zDbHeader[0x17] = '\0';
              zDbHeader[0x18] = '\0';
              zDbHeader[0x19] = '\0';
              zDbHeader[0x1a] = '\0';
              zDbHeader[0x1b] = '\0';
              zDbHeader[0x1c] = '\0';
              zDbHeader[0x1d] = '\0';
              zDbHeader[0x1e] = '\0';
              zDbHeader[0x1f] = '\0';
              zDbHeader[0x60] = '\0';
              zDbHeader[0x61] = '\0';
              zDbHeader[0x62] = '\0';
              zDbHeader[99] = '\0';
              zDbHeader[0] = '\0';
              zDbHeader[1] = '\0';
              zDbHeader[2] = '\0';
              zDbHeader[3] = '\0';
              zDbHeader[4] = '\0';
              zDbHeader[5] = '\0';
              zDbHeader[6] = '\0';
              zDbHeader[7] = '\0';
              zDbHeader[8] = '\0';
              zDbHeader[9] = '\0';
              zDbHeader[10] = '\0';
              zDbHeader[0xb] = '\0';
              zDbHeader[0xc] = '\0';
              zDbHeader[0xd] = '\0';
              zDbHeader[0xe] = '\0';
              zDbHeader[0xf] = '\0';
              psVar4 = p_00->pPager->fd;
              psVar5 = psVar4->pMethods;
              if (((psVar5 == (sqlite3_io_methods *)0x0) ||
                  (iVar6 = (*psVar5->xRead)(psVar4,zDbHeader,100,0), iVar6 == 0x20a)) ||
                 (iVar6 == 0)) {
                p_00->openFlags = (u8)local_10c;
                p_00->db = db;
                pPVar11 = p_00->pPager;
                pPVar11->xBusyHandler = btreeInvokeBusyHandler;
                pPVar11->pBusyHandlerArg = p_00;
                psVar5 = pPVar11->fd->pMethods;
                if (psVar5 != (sqlite3_io_methods *)0x0) {
                  (*psVar5->xFileControl)(pPVar11->fd,0xf,&pPVar11->xBusyHandler);
                  pPVar11 = p_00->pPager;
                }
                p->pBt = p_00;
                p_00->pCursor = (BtCursor *)0x0;
                p_00->pPage1 = (MemPage *)0x0;
                if (pPVar11->readOnly != '\0') {
                  *(byte *)&p_00->btsFlags = (byte)p_00->btsFlags | 1;
                }
                iVar6 = (int)((zDbHeader._16_8_ & 0xff) << 8);
                uVar10 = (uint)zDbHeader[0x11] * 0x10000 + iVar6;
                p_00->pageSize = uVar10;
                if (((iVar6 + (uint)zDbHeader[0x11] * 0x10000) - 0x10001 < 0xffff01ff) ||
                   ((uVar10 + 0x1ffff & uVar10) != 0)) {
                  p_00->pageSize = 0;
                  uVar10 = 0;
                  if (zFilename != (char *)0x0 && bVar16 == 0) {
                    p_00->autoVacuum = '\0';
                    p_00->incrVacuum = '\0';
                    uVar10 = 0;
                  }
                }
                else {
                  uVar10 = (uint)zDbHeader[0x14];
                  p_00->btsFlags = p_00->btsFlags | 2;
                  p_00->autoVacuum =
                       (((uint)zDbHeader._52_4_ >> 0x18 != 0 ||
                        (zDbHeader._48_8_ & 0xff000000000000) != 0) ||
                       (zDbHeader._48_8_ & 0xff0000000000) != 0) ||
                       (zDbHeader._48_8_ & 0xff00000000) != 0;
                  p_00->incrVacuum =
                       (((uint)zDbHeader._64_4_ >> 0x18 != 0 || (zDbHeader._64_8_ & 0xff0000) != 0)
                       || (zDbHeader._64_8_ & 0xff00) != 0) || (zDbHeader._64_8_ & 0xff) != 0;
                }
                iVar6 = sqlite3PagerSetPagesize(pPVar11,&p_00->pageSize,uVar10);
                if (iVar6 == 0) {
                  p_00->usableSize = p_00->pageSize - uVar10;
                  p_00->nRef = 1;
                  if (p->sharable == '\0') goto LAB_002202e8;
                  if (sqlite3Config.bCoreMutex != 0) {
                    psVar14 = (*sqlite3Config.mutex.xMutexAlloc)(2);
                    if (sqlite3Config.bCoreMutex != 0) {
                      psVar15 = (*sqlite3Config.mutex.xMutexAlloc)(0);
                      p_00->mutex = psVar15;
                      if (psVar15 == (sqlite3_mutex *)0x0) {
                        iVar6 = 7;
                        goto LAB_00220553;
                      }
                    }
                    if (psVar14 != (sqlite3_mutex *)0x0) {
                      (*sqlite3Config.mutex.xMutexEnter)(psVar14);
                      p_00->pNext = sqlite3SharedCacheList;
                      sqlite3SharedCacheList = p_00;
                      (*sqlite3Config.mutex.xMutexLeave)(psVar14);
                      goto LAB_002202e8;
                    }
                  }
                  p_00->pNext = sqlite3SharedCacheList;
                  sqlite3SharedCacheList = p_00;
                  goto LAB_002202e8;
                }
              }
              goto LAB_00220553;
            }
          }
        }
        else {
          local_ac = 0;
          iVar6 = (*pVfs->xOpen)(pVfs,pPVar11->zFilename,pPVar11->fd,uVar10 & 0x87f7f,
                                 (int *)&local_ac);
          if (iVar6 == 0) {
            uVar7 = local_ac & 1;
            bVar30 = (byte)uVar7;
            uVar10 = (*pPVar11->fd->pMethods->xDeviceCharacteristics)(pPVar11->fd);
            if (uVar7 == 0) {
              setSectorSize(pPVar11);
              uVar7 = pPVar11->sectorSize;
              if (0x1000 < uVar7) {
                if (uVar7 < 0x2001) {
                  zDbHeader[0] = (char)uVar7;
                  zDbHeader[1] = (char)(uVar7 >> 8);
                  zDbHeader[2] = (char)(uVar7 >> 0x10);
                  zDbHeader[3] = (char)(uVar7 >> 0x18);
                }
                else {
                  zDbHeader[0] = '\0';
                  zDbHeader[1] = ' ';
                  zDbHeader[2] = '\0';
                  zDbHeader[3] = '\0';
                }
              }
            }
            iVar6 = sqlite3_uri_boolean(local_d8,"nolock",0);
            pPVar11->noLock = (u8)iVar6;
            if (((uVar10 >> 0xd & 1) != 0) ||
               (iVar6 = sqlite3_uri_boolean(local_d8,"immutable",0), iVar6 != 0)) {
              uVar10 = 1;
              goto LAB_00220481;
            }
            bVar31 = true;
            uVar28 = '\0';
            goto LAB_00220494;
          }
        }
        psVar4 = pPVar11->fd;
        if (psVar4->pMethods != (sqlite3_io_methods *)0x0) {
          (*psVar4->pMethods->xClose)(psVar4);
          psVar4->pMethods = (sqlite3_io_methods *)0x0;
        }
        pcache1Free(pPVar11->pTmpSpace);
        goto LAB_00220549;
      }
      sqlite3DbFree((sqlite3 *)0x0,local_118);
LAB_0022021f:
      iVar6 = 7;
    }
LAB_00220553:
    if (p_00->pPager != (Pager *)0x0) {
      sqlite3PagerClose(p_00->pPager,(sqlite3 *)0x0);
    }
  }
  sqlite3_free(p_00);
  sqlite3_free(p);
  *ppBtree = (Btree *)0x0;
  goto LAB_00220581;
LAB_0022028a:
  if ((int)uVar12 < 1) goto LAB_002202b2;
  lVar3 = *(long *)((long)&db->aDb->zDbSName + lVar17);
  if ((lVar3 != 0) && (*(BtShared **)(lVar3 + 8) == p_00)) {
    if (!bVar31) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar14);
    }
    if (!bVar32) {
      (*sqlite3Config.mutex.xMutexLeave)(local_120);
    }
    sqlite3_free(pcVar29);
    sqlite3_free(p);
    iVar6 = 0x13;
    goto LAB_00220592;
  }
  uVar12 = (ulong)((int)uVar12 - 1);
  lVar17 = lVar17 + -0x20;
  goto LAB_0022028a;
LAB_002202b2:
  p->pBt = p_00;
  p_00->nRef = p_00->nRef + 1;
LAB_002202bf:
  if (!bVar31) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar14);
  }
  sqlite3_free(pcVar29);
  if (p_00 == (BtShared *)0x0) goto LAB_0021fce4;
LAB_002202e8:
  if (p->sharable != '\0') {
    uVar18 = 0;
    uVar12 = (ulong)(uint)db->nDb;
    if (db->nDb < 1) {
      uVar12 = uVar18;
    }
    for (; uVar12 * 0x20 != uVar18; uVar18 = uVar18 + 0x20) {
      pBVar25 = *(Btree **)((long)&db->aDb->pBt + uVar18);
      if ((pBVar25 != (Btree *)0x0) && (pBVar25->sharable != '\0')) goto LAB_0022032e;
    }
  }
  goto LAB_002203f0;
LAB_0022032e:
  do {
    pBVar21 = pBVar25;
    pBVar25 = pBVar21->pPrev;
  } while (pBVar21->pPrev != (Btree *)0x0);
  lVar17 = 0x20;
  if (p->pBt < pBVar21->pBt) {
    ppBVar26 = &pBVar21->pPrev;
    pBVar19 = (Btree *)0x0;
    pBVar25 = p;
  }
  else {
    do {
      pBVar24 = pBVar21;
      pBVar25 = pBVar24->pNext;
      if (pBVar25 == (Btree *)0x0) {
        ppBVar26 = &pBVar24->pNext;
        pBVar21 = (Btree *)0x0;
        pBVar19 = pBVar24;
        pBVar25 = p;
        goto LAB_002203e5;
      }
      pBVar21 = pBVar25;
    } while (pBVar25->pBt < p->pBt);
    ppBVar26 = &pBVar24->pNext;
    p->pNext = pBVar25;
    lVar17 = 0x28;
    pBVar19 = p;
    pBVar21 = pBVar24;
  }
LAB_002203e5:
  *(Btree **)((long)&p->db + lVar17) = pBVar21;
  pBVar25->pPrev = pBVar19;
  *ppBVar26 = p;
LAB_002203f0:
  *ppBtree = p;
  iVar6 = 0;
  pvVar13 = sqlite3BtreeSchema(p,0,(_func_void_void_ptr *)0x0);
  if (pvVar13 == (void *)0x0) {
    sqlite3PagerSetCachesize(p->pBt->pPager,-2000);
  }
  psVar4 = p_00->pPager->fd;
  psVar5 = psVar4->pMethods;
  if (psVar5 != (sqlite3_io_methods *)0x0) {
    (*psVar5->xFileControl)(psVar4,0x1e,&p_00->db);
  }
LAB_00220581:
  if (local_120 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(local_120);
  }
LAB_00220592:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return iVar6;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeOpen(
  sqlite3_vfs *pVfs,      /* VFS to use for this b-tree */
  const char *zFilename,  /* Name of the file containing the BTree database */
  sqlite3 *db,            /* Associated database handle */
  Btree **ppBtree,        /* Pointer to new Btree object written here */
  int flags,              /* Options */
  int vfsFlags            /* Flags passed through to sqlite3_vfs.xOpen() */
){
  BtShared *pBt = 0;             /* Shared part of btree structure */
  Btree *p;                      /* Handle to return */
  sqlite3_mutex *mutexOpen = 0;  /* Prevents a race condition. Ticket #3537 */
  int rc = SQLITE_OK;            /* Result code from this function */
  u8 nReserve;                   /* Byte of unused space on each page */
  unsigned char zDbHeader[100];  /* Database header content */

  /* True if opening an ephemeral, temporary database */
  const int isTempDb = zFilename==0 || zFilename[0]==0;

  /* Set the variable isMemdb to true for an in-memory database, or 
  ** false for a file-based database.
  */
#ifdef SQLITE_OMIT_MEMORYDB
  const int isMemdb = 0;
#else
  const int isMemdb = (zFilename && strcmp(zFilename, ":memory:")==0)
                       || (isTempDb && sqlite3TempInMemory(db))
                       || (vfsFlags & SQLITE_OPEN_MEMORY)!=0;
#endif

  assert( db!=0 );
  assert( pVfs!=0 );
  assert( sqlite3_mutex_held(db->mutex) );
  assert( (flags&0xff)==flags );   /* flags fit in 8 bits */

  /* Only a BTREE_SINGLE database can be BTREE_UNORDERED */
  assert( (flags & BTREE_UNORDERED)==0 || (flags & BTREE_SINGLE)!=0 );

  /* A BTREE_SINGLE database is always a temporary and/or ephemeral */
  assert( (flags & BTREE_SINGLE)==0 || isTempDb );

  if( isMemdb ){
    flags |= BTREE_MEMORY;
  }
  if( (vfsFlags & SQLITE_OPEN_MAIN_DB)!=0 && (isMemdb || isTempDb) ){
    vfsFlags = (vfsFlags & ~SQLITE_OPEN_MAIN_DB) | SQLITE_OPEN_TEMP_DB;
  }
  p = sqlite3MallocZero(sizeof(Btree));
  if( !p ){
    return SQLITE_NOMEM_BKPT;
  }
  p->inTrans = TRANS_NONE;
  p->db = db;
#ifndef SQLITE_OMIT_SHARED_CACHE
  p->lock.pBtree = p;
  p->lock.iTable = 1;
#endif

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
  /*
  ** If this Btree is a candidate for shared cache, try to find an
  ** existing BtShared object that we can share with
  */
  if( isTempDb==0 && (isMemdb==0 || (vfsFlags&SQLITE_OPEN_URI)!=0) ){
    if( vfsFlags & SQLITE_OPEN_SHAREDCACHE ){
      int nFilename = sqlite3Strlen30(zFilename)+1;
      int nFullPathname = pVfs->mxPathname+1;
      char *zFullPathname = sqlite3Malloc(MAX(nFullPathname,nFilename));
      MUTEX_LOGIC( sqlite3_mutex *mutexShared; )

      p->sharable = 1;
      if( !zFullPathname ){
        sqlite3_free(p);
        return SQLITE_NOMEM_BKPT;
      }
      if( isMemdb ){
        memcpy(zFullPathname, zFilename, nFilename);
      }else{
        rc = sqlite3OsFullPathname(pVfs, zFilename,
                                   nFullPathname, zFullPathname);
        if( rc ){
          sqlite3_free(zFullPathname);
          sqlite3_free(p);
          return rc;
        }
      }
#if SQLITE_THREADSAFE
      mutexOpen = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_OPEN);
      sqlite3_mutex_enter(mutexOpen);
      mutexShared = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);
      sqlite3_mutex_enter(mutexShared);
#endif
      for(pBt=GLOBAL(BtShared*,sqlite3SharedCacheList); pBt; pBt=pBt->pNext){
        assert( pBt->nRef>0 );
        if( 0==strcmp(zFullPathname, sqlite3PagerFilename(pBt->pPager, 0))
                 && sqlite3PagerVfs(pBt->pPager)==pVfs ){
          int iDb;
          for(iDb=db->nDb-1; iDb>=0; iDb--){
            Btree *pExisting = db->aDb[iDb].pBt;
            if( pExisting && pExisting->pBt==pBt ){
              sqlite3_mutex_leave(mutexShared);
              sqlite3_mutex_leave(mutexOpen);
              sqlite3_free(zFullPathname);
              sqlite3_free(p);
              return SQLITE_CONSTRAINT;
            }
          }
          p->pBt = pBt;
          pBt->nRef++;
          break;
        }
      }
      sqlite3_mutex_leave(mutexShared);
      sqlite3_free(zFullPathname);
    }
#ifdef SQLITE_DEBUG
    else{
      /* In debug mode, we mark all persistent databases as sharable
      ** even when they are not.  This exercises the locking code and
      ** gives more opportunity for asserts(sqlite3_mutex_held())
      ** statements to find locking problems.
      */
      p->sharable = 1;
    }
#endif
  }
#endif
  if( pBt==0 ){
    /*
    ** The following asserts make sure that structures used by the btree are
    ** the right size.  This is to guard against size changes that result
    ** when compiling on a different architecture.
    */
    assert( sizeof(i64)==8 );
    assert( sizeof(u64)==8 );
    assert( sizeof(u32)==4 );
    assert( sizeof(u16)==2 );
    assert( sizeof(Pgno)==4 );
  
    pBt = sqlite3MallocZero( sizeof(*pBt) );
    if( pBt==0 ){
      rc = SQLITE_NOMEM_BKPT;
      goto btree_open_out;
    }
    rc = sqlite3PagerOpen(pVfs, &pBt->pPager, zFilename,
                          sizeof(MemPage), flags, vfsFlags, pageReinit);
    if( rc==SQLITE_OK ){
      sqlite3PagerSetMmapLimit(pBt->pPager, db->szMmap);
      rc = sqlite3PagerReadFileheader(pBt->pPager,sizeof(zDbHeader),zDbHeader);
    }
    if( rc!=SQLITE_OK ){
      goto btree_open_out;
    }
    pBt->openFlags = (u8)flags;
    pBt->db = db;
    sqlite3PagerSetBusyhandler(pBt->pPager, btreeInvokeBusyHandler, pBt);
    p->pBt = pBt;
  
    pBt->pCursor = 0;
    pBt->pPage1 = 0;
    if( sqlite3PagerIsreadonly(pBt->pPager) ) pBt->btsFlags |= BTS_READ_ONLY;
#if defined(SQLITE_SECURE_DELETE)
    pBt->btsFlags |= BTS_SECURE_DELETE;
#elif defined(SQLITE_FAST_SECURE_DELETE)
    pBt->btsFlags |= BTS_OVERWRITE;
#endif
    /* EVIDENCE-OF: R-51873-39618 The page size for a database file is
    ** determined by the 2-byte integer located at an offset of 16 bytes from
    ** the beginning of the database file. */
    pBt->pageSize = (zDbHeader[16]<<8) | (zDbHeader[17]<<16);
    if( pBt->pageSize<512 || pBt->pageSize>SQLITE_MAX_PAGE_SIZE
         || ((pBt->pageSize-1)&pBt->pageSize)!=0 ){
      pBt->pageSize = 0;
#ifndef SQLITE_OMIT_AUTOVACUUM
      /* If the magic name ":memory:" will create an in-memory database, then
      ** leave the autoVacuum mode at 0 (do not auto-vacuum), even if
      ** SQLITE_DEFAULT_AUTOVACUUM is true. On the other hand, if
      ** SQLITE_OMIT_MEMORYDB has been defined, then ":memory:" is just a
      ** regular file-name. In this case the auto-vacuum applies as per normal.
      */
      if( zFilename && !isMemdb ){
        pBt->autoVacuum = (SQLITE_DEFAULT_AUTOVACUUM ? 1 : 0);
        pBt->incrVacuum = (SQLITE_DEFAULT_AUTOVACUUM==2 ? 1 : 0);
      }
#endif
      nReserve = 0;
    }else{
      /* EVIDENCE-OF: R-37497-42412 The size of the reserved region is
      ** determined by the one-byte unsigned integer found at an offset of 20
      ** into the database file header. */
      nReserve = zDbHeader[20];
      pBt->btsFlags |= BTS_PAGESIZE_FIXED;
#ifndef SQLITE_OMIT_AUTOVACUUM
      pBt->autoVacuum = (get4byte(&zDbHeader[36 + 4*4])?1:0);
      pBt->incrVacuum = (get4byte(&zDbHeader[36 + 7*4])?1:0);
#endif
    }
    rc = sqlite3PagerSetPagesize(pBt->pPager, &pBt->pageSize, nReserve);
    if( rc ) goto btree_open_out;
    pBt->usableSize = pBt->pageSize - nReserve;
    assert( (pBt->pageSize & 7)==0 );  /* 8-byte alignment of pageSize */
   
#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
    /* Add the new BtShared object to the linked list sharable BtShareds.
    */
    pBt->nRef = 1;
    if( p->sharable ){
      MUTEX_LOGIC( sqlite3_mutex *mutexShared; )
      MUTEX_LOGIC( mutexShared = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);)
      if( SQLITE_THREADSAFE && sqlite3GlobalConfig.bCoreMutex ){
        pBt->mutex = sqlite3MutexAlloc(SQLITE_MUTEX_FAST);
        if( pBt->mutex==0 ){
          rc = SQLITE_NOMEM_BKPT;
          goto btree_open_out;
        }
      }
      sqlite3_mutex_enter(mutexShared);
      pBt->pNext = GLOBAL(BtShared*,sqlite3SharedCacheList);
      GLOBAL(BtShared*,sqlite3SharedCacheList) = pBt;
      sqlite3_mutex_leave(mutexShared);
    }
#endif
  }

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
  /* If the new Btree uses a sharable pBtShared, then link the new
  ** Btree into the list of all sharable Btrees for the same connection.
  ** The list is kept in ascending order by pBt address.
  */
  if( p->sharable ){
    int i;
    Btree *pSib;
    for(i=0; i<db->nDb; i++){
      if( (pSib = db->aDb[i].pBt)!=0 && pSib->sharable ){
        while( pSib->pPrev ){ pSib = pSib->pPrev; }
        if( (uptr)p->pBt<(uptr)pSib->pBt ){
          p->pNext = pSib;
          p->pPrev = 0;
          pSib->pPrev = p;
        }else{
          while( pSib->pNext && (uptr)pSib->pNext->pBt<(uptr)p->pBt ){
            pSib = pSib->pNext;
          }
          p->pNext = pSib->pNext;
          p->pPrev = pSib;
          if( p->pNext ){
            p->pNext->pPrev = p;
          }
          pSib->pNext = p;
        }
        break;
      }
    }
  }
#endif
  *ppBtree = p;

btree_open_out:
  if( rc!=SQLITE_OK ){
    if( pBt && pBt->pPager ){
      sqlite3PagerClose(pBt->pPager, 0);
    }
    sqlite3_free(pBt);
    sqlite3_free(p);
    *ppBtree = 0;
  }else{
    sqlite3_file *pFile;

    /* If the B-Tree was successfully opened, set the pager-cache size to the
    ** default value. Except, when opening on an existing shared pager-cache,
    ** do not change the pager-cache size.
    */
    if( sqlite3BtreeSchema(p, 0, 0)==0 ){
      sqlite3PagerSetCachesize(p->pBt->pPager, SQLITE_DEFAULT_CACHE_SIZE);
    }

    pFile = sqlite3PagerFile(pBt->pPager);
    if( pFile->pMethods ){
      sqlite3OsFileControlHint(pFile, SQLITE_FCNTL_PDB, (void*)&pBt->db);
    }
  }
  if( mutexOpen ){
    assert( sqlite3_mutex_held(mutexOpen) );
    sqlite3_mutex_leave(mutexOpen);
  }
  assert( rc!=SQLITE_OK || sqlite3BtreeConnectionCount(*ppBtree)>0 );
  return rc;
}